

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlIOHTTPCloseWrite(void *context,char *http_mthd)

{
  size_t sVar1;
  void *ctx;
  xmlChar local_458 [8];
  xmlChar msg_1 [500];
  xmlChar local_258 [8];
  xmlChar msg [500];
  xmlOutputBufferPtr dctxt;
  void *http_ctxt;
  char *content_type;
  char *content_encoding;
  char *http_content;
  xmlIOHTTPWriteCtxtPtr ctxt;
  int local_28;
  int content_lgth;
  int http_rtn;
  int close_rc;
  char *http_mthd_local;
  void *context_local;
  
  content_lgth = -1;
  local_28 = 0;
  ctxt._4_4_ = 0;
  content_encoding = (char *)0x0;
  content_type = (char *)0x0;
  http_ctxt = anon_var_dwarf_55de1;
  if ((context == (void *)0x0) || (http_mthd == (char *)0x0)) {
    context_local._4_4_ = -1;
  }
  else {
    http_content = (char *)context;
    _http_rtn = http_mthd;
    http_mthd_local = (char *)context;
    if (*context < 1) {
      unique0x00012000 = *(long *)((long)context + 0x10);
      content_encoding = (char *)xmlBufContent(*(xmlBuf **)(unique0x00012000 + 0x20));
      sVar1 = xmlBufUse(*(xmlBufPtr *)(stack0xffffffffffffffa0 + 0x20));
      ctxt._4_4_ = (uint)sVar1;
    }
    else {
      ctxt._4_4_ = xmlZMemBuffGetContent
                             (*(xmlZMemBuffPtr *)((long)context + 0x10),&content_encoding);
      content_type = "Content-Encoding: gzip";
    }
    if (content_encoding == (char *)0x0) {
      xmlStrPrintf(local_258,500,"xmlIOHTTPCloseWrite:  %s \'%s\' %s \'%s\'.\n",
                   "Error retrieving content.\nUnable to",_http_rtn,"data to URI",
                   *(undefined8 *)(http_content + 8));
      xmlIOErr(0x60a,(char *)local_258);
    }
    else {
      ctx = xmlNanoHTTPMethod(*(char **)(http_content + 8),_http_rtn,content_encoding,
                              (char **)&http_ctxt,content_type,ctxt._4_4_);
      if (ctx != (void *)0x0) {
        local_28 = xmlNanoHTTPReturnCode(ctx);
        if ((local_28 < 200) || (299 < local_28)) {
          xmlStrPrintf(local_458,500,"xmlIOHTTPCloseWrite: HTTP \'%s\' of %d %s\n\'%s\' %s %d\n",
                       _http_rtn,(ulong)ctxt._4_4_,"bytes to URI",*(undefined8 *)(http_content + 8),
                       "failed.  HTTP return code:",local_28);
          xmlIOErr(0x60a,(char *)local_458);
        }
        else {
          content_lgth = 0;
        }
        xmlNanoHTTPClose(ctx);
        (*xmlFree)(http_ctxt);
      }
    }
    xmlFreeHTTPWriteCtxt((xmlIOHTTPWriteCtxtPtr)http_content);
    context_local._4_4_ = content_lgth;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlIOHTTPCloseWrite( void * context, const char * http_mthd ) {

    int				close_rc = -1;
    int				http_rtn = 0;
    int				content_lgth = 0;
    xmlIOHTTPWriteCtxtPtr	ctxt = context;

    char *			http_content = NULL;
    char *			content_encoding = NULL;
    char *			content_type = (char *) "text/xml";
    void *			http_ctxt = NULL;

    if ( ( ctxt == NULL ) || ( http_mthd == NULL ) )
	return ( -1 );

    /*  Retrieve the content from the appropriate buffer  */

#ifdef LIBXML_ZLIB_ENABLED

    if ( ctxt->compression > 0 ) {
	content_lgth = xmlZMemBuffGetContent( ctxt->doc_buff, &http_content );
	content_encoding = (char *) "Content-Encoding: gzip";
    }
    else
#endif
    {
	/*  Pull the data out of the memory output buffer  */

	xmlOutputBufferPtr	dctxt = ctxt->doc_buff;
	http_content = (char *) xmlBufContent(dctxt->buffer);
	content_lgth = xmlBufUse(dctxt->buffer);
    }

    if ( http_content == NULL ) {
	xmlChar msg[500];
	xmlStrPrintf(msg, 500,
		     "xmlIOHTTPCloseWrite:  %s '%s' %s '%s'.\n",
		     "Error retrieving content.\nUnable to",
		     http_mthd, "data to URI", ctxt->uri );
	xmlIOErr(XML_IO_WRITE, (const char *) msg);
    }

    else {

	http_ctxt = xmlNanoHTTPMethod( ctxt->uri, http_mthd, http_content,
					&content_type, content_encoding,
					content_lgth );

	if ( http_ctxt != NULL ) {
#ifdef DEBUG_HTTP
	    /*  If testing/debugging - dump reply with request content  */

	    FILE *	tst_file = NULL;
	    char	buffer[ 4096 ];
	    char *	dump_name = NULL;
	    int		avail;

	    xmlGenericError( xmlGenericErrorContext,
			"xmlNanoHTTPCloseWrite:  HTTP %s to\n%s returned %d.\n",
			http_mthd, ctxt->uri,
			xmlNanoHTTPReturnCode( http_ctxt ) );

	    /*
	    **  Since either content or reply may be gzipped,
	    **  dump them to separate files instead of the
	    **  standard error context.
	    */

	    dump_name = tempnam( NULL, "lxml" );
	    if ( dump_name != NULL ) {
		(void)snprintf( buffer, sizeof(buffer), "%s.content", dump_name );

		tst_file = fopen( buffer, "wb" );
		if ( tst_file != NULL ) {
		    xmlGenericError( xmlGenericErrorContext,
			"Transmitted content saved in file:  %s\n", buffer );

		    fwrite( http_content, sizeof( char ),
					content_lgth, tst_file );
		    fclose( tst_file );
		}

		(void)snprintf( buffer, sizeof(buffer), "%s.reply", dump_name );
		tst_file = fopen( buffer, "wb" );
		if ( tst_file != NULL ) {
		    xmlGenericError( xmlGenericErrorContext,
			"Reply content saved in file:  %s\n", buffer );


		    while ( (avail = xmlNanoHTTPRead( http_ctxt,
					buffer, sizeof( buffer ) )) > 0 ) {

			fwrite( buffer, sizeof( char ), avail, tst_file );
		    }

		    fclose( tst_file );
		}

		free( dump_name );
	    }
#endif  /*  DEBUG_HTTP  */

	    http_rtn = xmlNanoHTTPReturnCode( http_ctxt );
	    if ( ( http_rtn >= 200 ) && ( http_rtn < 300 ) )
		close_rc = 0;
	    else {
                xmlChar msg[500];
                xmlStrPrintf(msg, 500,
                      "xmlIOHTTPCloseWrite: HTTP '%s' of %d %s\n'%s' %s %d\n",
			    http_mthd, content_lgth,
			    "bytes to URI", ctxt->uri,
			    "failed.  HTTP return code:", http_rtn );
		xmlIOErr(XML_IO_WRITE, (const char *) msg);
            }

	    xmlNanoHTTPClose( http_ctxt );
	    xmlFree( content_type );
	}
    }

    /*  Final cleanups  */

    xmlFreeHTTPWriteCtxt( ctxt );

    return ( close_rc );
}